

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,uint C2)

{
  bool bVar1;
  size_t offsetOfRelativeJumpOffsetFromEnd;
  uint uStack_28;
  OpLayoutT_BrReg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  uint C2_local;
  RegSlot R1_local;
  ByteCodeLabel labelID_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_28 = C2;
  layout._2_4_ = R1;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                    ((unsigned_short *)((long)&offsetOfRelativeJumpOffsetFromEnd + 4),R1);
  if ((bVar1) &&
     (bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                        ((unsigned_short *)((long)&offsetOfRelativeJumpOffsetFromEnd + 6),uStack_28)
     , bVar1)) {
    offsetOfRelativeJumpOffsetFromEnd._2_2_ = 6;
    Data::EncodeT<(Js::LayoutSize)1>
              (&this->m_byteCodeData,op,(void *)((long)&offsetOfRelativeJumpOffsetFromEnd + 2),6,
               this);
    AddJumpOffset(this,op,labelID,6);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg1Unsigned1(OpCode op, ByteCodeLabel labelID, RegSlot R1, uint C2)
    {
        OpLayoutT_BrReg1Unsigned1<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.C2, C2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg2<SizePolicy>) - offsetof(OpLayoutT_BrReg2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }